

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

void __thiscall cmCTestSVN::CleanupImpl(cmCTestSVN *this)

{
  vector<const_char_*,_std::allocator<const_char_*>_> svn_cleanup;
  OutputLogger out;
  OutputLogger err;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_a8;
  LineParser local_88;
  LineParser local_48;
  
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super_OutputParser._vptr_OutputParser = (_func_int **)0x44f527;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_a8,(char **)&local_88);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&local_88,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "cleanup-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&local_48,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "cleanup-err> ");
  RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_a8,
                &local_88.super_OutputParser,&local_48.super_OutputParser);
  cmProcessTools::LineParser::~LineParser(&local_48);
  cmProcessTools::LineParser::~LineParser(&local_88);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_a8);
  return;
}

Assistant:

void cmCTestSVN::CleanupImpl()
{
  std::vector<const char*> svn_cleanup;
  svn_cleanup.push_back("cleanup");
  OutputLogger out(this->Log, "cleanup-out> ");
  OutputLogger err(this->Log, "cleanup-err> ");
  this->RunSVNCommand(svn_cleanup, &out, &err);
}